

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O2

void __thiscall TCLAP::StdOutput::_longUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  Arg *pAVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar5;
  ulong uVar6;
  pointer ppAVar7;
  _List_node_base *p_Var8;
  allocator<char> local_e9;
  StdOutput *local_e8;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  string local_c0;
  XorHandler xorHandler;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  string local_70 [32];
  string message;
  
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xb])(_cmd);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            (&argList,(list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                      CONCAT44(extraout_var,iVar4));
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xe])(_cmd);
  std::__cxx11::string::string((string *)&message,(string *)CONCAT44(extraout_var_00,iVar4));
  iVar4 = (*_cmd->_vptr_CmdLineInterface[0xc])(_cmd);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&xorHandler._orList,
           (vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)CONCAT44(extraout_var_01,iVar4));
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(&xorList,&xorHandler._orList);
  uVar6 = 0;
  local_e8 = this;
  while( true ) {
    if ((ulong)(((long)xorList.
                       super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)xorList.
                      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar6) break;
    ppAVar7 = xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6].
              super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (ppAVar7 !=
           xorList.
           super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar6].
           super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      pAVar1 = *ppAVar7;
      std::__cxx11::string::string<std::allocator<char>>(local_70,"val",&local_e9);
      (*pAVar1->_vptr_Arg[9])(&local_c0,pAVar1,local_70);
      this = local_e8;
      spacePrint(local_e8,os,&local_c0,0x4b,3,3);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string(local_70);
      Arg::getDescription_abi_cxx11_(&local_c0,*ppAVar7);
      spacePrint(this,os,&local_c0,0x4b,5,0);
      std::__cxx11::string::~string((string *)&local_c0);
      ppAVar7 = ppAVar7 + 1;
      if (ppAVar7 !=
          xorList.
          super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar6].
          super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"-- OR --",(allocator<char> *)local_70);
        spacePrint(this,os,&local_c0,0x4b,9,0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
    poVar5 = std::endl<char,std::char_traits<char>>(os);
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar6 = uVar6 + 1;
  }
  p_Var8 = (_List_node_base *)&argList;
  while (p_Var8 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)&p_Var8->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)&argList) {
    bVar3 = XorHandler::contains(&xorHandler,(Arg *)p_Var8[1]._M_next);
    if (!bVar3) {
      plVar2 = (long *)p_Var8[1]._M_next;
      std::__cxx11::string::string<std::allocator<char>>(local_70,"val",&local_e9);
      (**(code **)(*plVar2 + 0x48))(&local_c0,plVar2,local_70);
      this = local_e8;
      spacePrint(local_e8,os,&local_c0,0x4b,3,3);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string(local_70);
      Arg::getDescription_abi_cxx11_(&local_c0,(Arg *)p_Var8[1]._M_next);
      spacePrint(this,os,&local_c0,0x4b,5,0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::endl<char,std::char_traits<char>>(os);
    }
  }
  std::endl<char,std::char_traits<char>>(os);
  spacePrint(this,os,&message,0x4b,3,0);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&xorList);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(&xorHandler._orList);
  std::__cxx11::string::~string((string *)&message);
  std::__cxx11::_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::_M_clear
            (&argList.super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>);
  return;
}

Assistant:

inline void 
StdOutput::_longUsage( CmdLineInterface& _cmd, 
					   std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string message = _cmd.getMessage();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	// first the xor 
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); 
				  it++ )
				{
					spacePrint( os, (*it)->longID(), 75, 3, 3 );
					spacePrint( os, (*it)->getDescription(), 75, 5, 0 );

					if ( it+1 != xorList[i].end() )
						spacePrint(os, "-- OR --", 75, 9, 0);
				}
			os << std::endl << std::endl;
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			{
				spacePrint( os, (*it)->longID(), 75, 3, 3 ); 
				spacePrint( os, (*it)->getDescription(), 75, 5, 0 ); 
				os << std::endl;
			}

	os << std::endl;

	spacePrint( os, message, 75, 3, 0 );
}